

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::SaveTextResult(Disassembler *this,spv_text *text_result)

{
  long lVar1;
  char *__dest;
  char *__src;
  undefined8 *__s;
  spv_text text;
  char *local_50;
  char *str;
  long local_28;
  size_t length;
  spv_text *text_result_local;
  Disassembler *this_local;
  
  if ((this->print_ & 1U) == 0) {
    length = (size_t)text_result;
    text_result_local = (spv_text *)this;
    std::__cxx11::stringstream::str();
    lVar1 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&str);
    local_28 = lVar1;
    __dest = (char *)operator_new__(lVar1 + 1);
    if (__dest == (char *)0x0) {
      return SPV_ERROR_OUT_OF_MEMORY;
    }
    local_50 = __dest;
    std::__cxx11::stringstream::str();
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(__dest,__src,local_28 + 1);
    std::__cxx11::string::~string((string *)&text);
    __s = (undefined8 *)operator_new(0x10);
    memset(__s,0,0x10);
    if (__s == (undefined8 *)0x0) {
      if (local_50 != (char *)0x0) {
        operator_delete__(local_50);
      }
      return SPV_ERROR_OUT_OF_MEMORY;
    }
    *__s = local_50;
    __s[1] = local_28;
    *(undefined8 **)length = __s;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Disassembler::SaveTextResult(spv_text* text_result) const {
  if (!print_) {
    size_t length = text_.str().size();
    char* str = new char[length + 1];
    if (!str) return SPV_ERROR_OUT_OF_MEMORY;
    strncpy(str, text_.str().c_str(), length + 1);
    spv_text text = new spv_text_t();
    if (!text) {
      delete[] str;
      return SPV_ERROR_OUT_OF_MEMORY;
    }
    text->str = str;
    text->length = length;
    *text_result = text;
  }
  return SPV_SUCCESS;
}